

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O2

void __thiscall
WDL_Resampler::WDL_Resampler_Filter::setParms
          (WDL_Resampler_Filter *this,double fpos,double fpos2,double Q,int hist_sz,int nch)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  int oldsz;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = 1.0;
  if (fpos < 1.0) {
    if ((0.97 <= fpos) && (this->m_state == -1)) {
      this->m_state = 0;
    }
    dVar7 = fpos * fpos2;
  }
  this->m_filtsz = hist_sz;
  uVar3 = nch * hist_sz * 4;
  uVar4 = (uint)(this->m_hist).m_hb.m_size >> 3;
  if (uVar4 != uVar3) {
    pdVar1 = WDL_TypedBuf<double>::Resize(&this->m_hist,uVar3,false);
    uVar3 = (uint)(this->m_hist).m_hb.m_size >> 3;
    iVar2 = uVar3 - uVar4;
    if (uVar4 <= uVar3 && iVar2 != 0) {
      memset(pdVar1 + uVar4,0,(long)iVar2 << 3);
    }
  }
  if (1e-06 <= ABS(dVar7 - this->m_fpos)) {
    this->m_fpos = dVar7;
    dVar7 = (double)(~-(ulong)(dVar7 == 1.0) & (ulong)dVar7 | (ulong)fpos2 & -(ulong)(dVar7 == 1.0))
            * 3.141592653589793;
    dVar5 = cos(dVar7);
    dVar7 = sin(dVar7);
    dVar7 = dVar7 / (Q + Q);
    dVar8 = 1.0 / (dVar7 + 1.0);
    dVar6 = (1.0 - dVar5) * dVar8;
    this->m_b1 = dVar6;
    dVar6 = dVar6 * 0.5;
    this->m_b0 = dVar6;
    this->m_b2 = dVar6;
    this->m_a1 = dVar5 * -2.0 * dVar8;
    this->m_a2 = (1.0 - dVar7) * dVar8;
  }
  return;
}

Assistant:

void setParms(double fpos, double fpos2, double Q, int hist_sz, int nch)
  {
    if (fpos < 1.0)
    {
       // if initial filter state is close to nyquist, fade-in
       // (in case this resampler was newly activated on varispeed media)
      if (m_state == -1 && fpos >= 0.97) m_state=0;
      fpos *= fpos2;
    }
    else
    {
      fpos = 1.0;
    }

    m_filtsz = hist_sz;
    hist_sz *= 4 * nch;
    if (m_hist.GetSize() != hist_sz)
    {
      const int oldsz = m_hist.GetSize();
      double *p = m_hist.Resize(hist_sz,false);
      if (m_hist.GetSize() > oldsz)
        memset(p+oldsz,0,(m_hist.GetSize() - oldsz)*sizeof(double));
    }

    if (fabs(fpos-m_fpos)<0.000001) return;
    m_fpos=fpos;

    const double pos = (fpos == 1.0 ? fpos2 : fpos) * PI;
    const double cpos=cos(pos);
    const double spos=sin(pos);
    const double alpha=spos/(2.0*Q);
    const double sc=1.0/( 1 + alpha);
    m_b1 = (1-cpos) * sc;
    m_b2 = m_b0 = m_b1*0.5;
    m_a1 =  -2 * cpos * sc;
    m_a2 = (1-alpha)*sc;
  }